

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O2

int g2d_polygon_rasterize(zarray_t *poly,double y,double *x)

{
  int iVar1;
  int iVar2;
  int idx;
  int iVar3;
  size_t __nmemb;
  int iVar4;
  double *p1_1;
  double *p0_1;
  double p1 [2];
  g2d_line_t line;
  double p0 [2];
  
  iVar1 = zarray_size(poly);
  p0[0] = 0.0;
  p1[0] = 1.0;
  p1[1] = y;
  p0[1] = y;
  g2d_line_init_from_points(&line,p0,p1);
  iVar4 = 0;
  iVar3 = iVar1;
  if (iVar1 < 1) {
    iVar3 = 0;
  }
  idx = 0;
  while (__nmemb = (size_t)iVar4, iVar3 != idx) {
    zarray_get_volatile(poly,idx,&p0_1);
    idx = idx + 1;
    zarray_get_volatile(poly,idx % iVar1,&p1_1);
    g2d_line_segment_init_from_points((g2d_line_segment_t *)p0,p0_1,p1_1);
    iVar2 = g2d_line_segment_intersect_line((g2d_line_segment_t *)p0,&line,p1);
    if (iVar2 != 0) {
      iVar4 = iVar4 + 1;
      x[__nmemb] = p1[0];
    }
  }
  qsort(x,__nmemb,8,double_sort_up);
  return iVar4;
}

Assistant:

int g2d_polygon_rasterize(const zarray_t *poly, double y, double *x)
{
    int sz = zarray_size(poly);

    g2d_line_t line;
    if (1) {
        double p0[2] = { 0, y };
        double p1[2] = { 1, y };

        g2d_line_init_from_points(&line, p0, p1);
    }

    int xpos = 0;

    for (int i = 0; i < sz; i++) {
        g2d_line_segment_t seg;
        double *p0, *p1;
        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1)%sz, &p1);

        g2d_line_segment_init_from_points(&seg, p0, p1);

        double q[2];
        if (g2d_line_segment_intersect_line(&seg, &line, q))
            x[xpos++] = q[0];
    }

    qsort(x, xpos, sizeof(double), double_sort_up);

    return xpos;
}